

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O0

void add2P(int v)

{
  bool bVar1;
  long lVar2;
  bool local_75;
  bool local_73;
  undefined1 local_70 [32];
  undefined1 local_50 [16];
  undefined1 local_40 [24];
  int u_1;
  int _p__1;
  int u;
  int _p_;
  int local_c;
  int v_local;
  
  local_c = v;
  std::bitset<15000UL>::set(&P,(long)v,true);
  sizeP = sizeP + 1;
  std::bitset<15000UL>::operator[]((bitset<15000UL> *)&u,0x52b91d0);
  bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&u);
  std::bitset<15000UL>::reference::~reference((reference *)&u);
  if (bVar1) {
    std::bitset<15000UL>::reset(&Cp,(long)local_c);
    out_Cp(local_c);
  }
  else {
    std::bitset<15000UL>::reset(&Cm,(long)local_c);
    out_Cm(local_c);
  }
  sizeC = sizeC + -1;
  CE_P_P = CE_P_[local_c] + CE_P_P;
  lVar2 = (long)cnt_lP;
  cnt_lP = cnt_lP + 1;
  lP[lVar2] = local_c;
  _p__1 = AdjP[local_c];
  u_1 = AdjB[_p__1];
  while (_p__1 < AdjP[local_c + 1]) {
    neiC[u_1] = neiC[u_1] + -1;
    neiP[u_1] = neiP[u_1] + 1;
    _p__1 = _p__1 + 1;
    u_1 = AdjB[_p__1];
  }
  local_40._20_4_ = NAdjP[local_c];
  local_40._16_4_ = NAdjB[(int)local_40._20_4_];
  while ((int)local_40._20_4_ < NAdjP[local_c + 1]) {
    std::bitset<15000UL>::operator[]((bitset<15000UL> *)local_40,0x52b8a78);
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)local_40);
    local_70[0x13] = 0;
    local_73 = true;
    if (!bVar1) {
      std::bitset<15000UL>::operator[]((bitset<15000UL> *)local_50,0x52b91d0);
      local_70[0x13] = 1;
      local_73 = std::bitset::reference::operator_cast_to_bool((reference *)local_50);
    }
    if ((local_70[0x13] & 1) != 0) {
      std::bitset<15000UL>::reference::~reference((reference *)local_50);
    }
    std::bitset<15000UL>::reference::~reference((reference *)local_40);
    if (local_73 != false) {
      CE_Cp_P = CE_Cp_P + 1;
    }
    local_75 = false;
    if (CE_P_[(int)local_40._16_4_] == 0) {
      std::bitset<15000UL>::operator[]((bitset<15000UL> *)local_70,0x52b8a78);
      local_75 = std::bitset::reference::operator_cast_to_bool((reference *)local_70);
      std::bitset<15000UL>::reference::~reference((reference *)local_70);
    }
    if (local_75 != false) {
      add_from_Cm_to_Cp(local_40._16_4_);
    }
    CE_P_[(int)local_40._16_4_] = CE_P_[(int)local_40._16_4_] + 1;
    local_40._20_4_ = local_40._20_4_ + 1;
    local_40._16_4_ = NAdjB[(int)local_40._20_4_];
  }
  return;
}

Assistant:

inline void add2P(int v) {
    P.set(v); ++sizeP;
    if(Cp[v]) {Cp.reset(v); out_Cp(v);}
    else {Cm.reset(v); out_Cm(v);}
    --sizeC;

    CE_P_P += CE_P_[v];
    lP[cnt_lP++] = v;

    FOR_NA(v, u) {--neiC[u]; ++neiP[u];}

    FOR_C_NA(v, u) {
        if (Cm[u] || Cp[u]) ++CE_Cp_P;
        if (CE_P_[u] == 0 && Cm[u])
            add_from_Cm_to_Cp(u);
        ++CE_P_[u];
    }
}